

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O3

bool __thiscall axl::cry::X509Cert::loadPem(X509Cert *this,void *p,size_t size)

{
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> HVar1;
  bool bVar2;
  X509 *pXVar3;
  Bio bio;
  X509 *cert;
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> local_28;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_20;
  
  pXVar3 = (X509 *)(this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).
                   m_h;
  if (pXVar3 != (X509 *)0x0) {
    X509_free(pXVar3);
    (this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).m_h =
         (x509_st *)0x0;
  }
  local_28.m_h = (bio_st *)0x0;
  Bio::createMemBuf((Bio *)&local_28,p,size);
  local_20.m_h = (x509_st *)X509_new();
  pXVar3 = PEM_read_bio_X509((BIO *)local_28.m_h,(X509 **)&local_20,(undefined1 *)0x0,(void *)0x0);
  HVar1.m_h = local_20.m_h;
  if (pXVar3 == (X509 *)0x0) {
    bVar2 = failWithLastCryptoError<bool>(false);
  }
  else {
    pXVar3 = (X509 *)(this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).
                     m_h;
    if (pXVar3 != (X509 *)0x0) {
      X509_free(pXVar3);
    }
    (this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).m_h = HVar1.m_h;
    bVar2 = true;
  }
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle(&local_28);
  return bVar2;
}

Assistant:

bool
X509Cert::loadPem(
	const void* p,
	size_t size
) {
	close();

	Bio bio;
	bio.createMemBuf(p, size);

	X509* cert = X509_new();
	X509* result = PEM_read_bio_X509(bio, &cert, NULL, NULL);
	if (!result) {
		ASSERT(cert == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(cert);
	return true;
}